

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

void __thiscall PlanTest::TestPoolWithDepthOne(PlanTest *this,char *test_case)

{
  Plan *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Test *pTVar3;
  bool bVar4;
  int iVar5;
  Node *pNVar6;
  Edge *pEVar7;
  Edge *pEVar8;
  string err;
  string local_70;
  string local_50;
  
  iVar5 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_StateTestWithBuiltinRules).state_,test_case,(ManifestParserOptions)0x0);
  if (iVar5 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"out1","");
  pNVar6 = StateTestWithBuiltinRules::GetNode(&this->super_StateTestWithBuiltinRules,&local_70);
  pNVar6->dirty_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"out2","");
  pNVar6 = StateTestWithBuiltinRules::GetNode(&this->super_StateTestWithBuiltinRules,&local_70);
  pNVar6->dirty_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  pTVar3 = g_current_test;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_50.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"out1","");
  pNVar6 = StateTestWithBuiltinRules::GetNode(&this->super_StateTestWithBuiltinRules,&local_50);
  this_00 = &this->plan_;
  bVar4 = Plan::AddTarget(this_00,pNVar6,&local_70);
  testing::Test::Check
            (pTVar3,bVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
             ,0xcd,"plan_.AddTarget(GetNode(\"out1\"), &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = g_current_test;
  iVar5 = std::__cxx11::string::compare((char *)&local_70);
  bVar4 = testing::Test::Check
                    (pTVar3,iVar5 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                     ,0xce,"\"\" == err");
  pTVar3 = g_current_test;
  if (bVar4) {
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"out2","");
    pNVar6 = StateTestWithBuiltinRules::GetNode(&this->super_StateTestWithBuiltinRules,&local_50);
    bVar4 = Plan::AddTarget(this_00,pNVar6,&local_70);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0xcf,"plan_.AddTarget(GetNode(\"out2\"), &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pTVar3 = g_current_test;
    iVar5 = std::__cxx11::string::compare((char *)&local_70);
    bVar4 = testing::Test::Check
                      (pTVar3,iVar5 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                       ,0xd0,"\"\" == err");
    if ((bVar4) &&
       (bVar4 = testing::Test::Check
                          (g_current_test,
                           0 < (this->plan_).command_edges_ && 0 < (this->plan_).wanted_edges_,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0xd1,"plan_.more_to_do()"), bVar4)) {
      pEVar7 = Plan::FindWork(this_00);
      bVar4 = testing::Test::Check
                        (g_current_test,pEVar7 != (Edge *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                         ,0xd4,"edge");
      pTVar3 = g_current_test;
      if (bVar4) {
        iVar5 = std::__cxx11::string::compare
                          ((char *)&(*(pEVar7->inputs_).
                                      super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                      super__Vector_impl_data._M_start)->env_path_);
        bVar4 = testing::Test::Check
                          (pTVar3,iVar5 == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0xd5,"\"in\" == edge->inputs_[0]->path()");
        pTVar3 = g_current_test;
        if (bVar4) {
          iVar5 = std::__cxx11::string::compare
                            ((char *)&(*(pEVar7->outputs_).
                                        super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                        super__Vector_impl_data._M_start)->env_path_);
          bVar4 = testing::Test::Check
                            (pTVar3,iVar5 == 0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                             ,0xd6,"\"out1\" == edge->outputs_[0]->path()");
          pTVar3 = g_current_test;
          if (bVar4) {
            pEVar8 = Plan::FindWork(this_00);
            bVar4 = testing::Test::Check
                              (pTVar3,pEVar8 == (Edge *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                               ,0xd9,"plan_.FindWork()");
            if (bVar4) {
              Plan::EdgeFinished(this_00,pEVar7,kEdgeSucceeded,&local_70);
              pTVar3 = g_current_test;
              iVar5 = std::__cxx11::string::compare((char *)&local_70);
              bVar4 = testing::Test::Check
                                (pTVar3,iVar5 == 0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                 ,0xdc,"\"\" == err");
              if (bVar4) {
                pEVar7 = Plan::FindWork(this_00);
                bVar4 = testing::Test::Check
                                  (g_current_test,pEVar7 != (Edge *)0x0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                   ,0xdf,"edge");
                pTVar3 = g_current_test;
                if (bVar4) {
                  iVar5 = std::__cxx11::string::compare
                                    ((char *)&(*(pEVar7->inputs_).
                                                super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                                _M_impl.super__Vector_impl_data._M_start)->env_path_
                                    );
                  bVar4 = testing::Test::Check
                                    (pTVar3,iVar5 == 0,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                     ,0xe0,"\"in\" == edge->inputs_[0]->path()");
                  pTVar3 = g_current_test;
                  if (bVar4) {
                    iVar5 = std::__cxx11::string::compare
                                      ((char *)&(*(pEVar7->outputs_).
                                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                env_path_);
                    bVar4 = testing::Test::Check
                                      (pTVar3,iVar5 == 0,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                       ,0xe1,"\"out2\" == edge->outputs_[0]->path()");
                    pTVar3 = g_current_test;
                    if (bVar4) {
                      pEVar8 = Plan::FindWork(this_00);
                      bVar4 = testing::Test::Check
                                        (pTVar3,pEVar8 == (Edge *)0x0,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                         ,0xe3,"plan_.FindWork()");
                      if (bVar4) {
                        Plan::EdgeFinished(this_00,pEVar7,kEdgeSucceeded,&local_70);
                        pTVar3 = g_current_test;
                        iVar5 = std::__cxx11::string::compare((char *)&local_70);
                        bVar4 = testing::Test::Check
                                          (pTVar3,iVar5 == 0,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                           ,0xe6,"\"\" == err");
                        if ((bVar4) &&
                           (bVar4 = testing::Test::Check
                                              (g_current_test,
                                               (this->plan_).command_edges_ < 1 ||
                                               (this->plan_).wanted_edges_ < 1,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                               ,0xe8,"plan_.more_to_do()"), bVar4)) {
                          pEVar7 = Plan::FindWork(this_00);
                          bVar4 = testing::Test::Check
                                            (g_current_test,pEVar7 == (Edge *)0x0,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                             ,0xea,"0 == edge");
                          if (bVar4) goto LAB_00120929;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_00120929:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void PlanTest::TestPoolWithDepthOne(const char* test_case) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_, test_case));
  GetNode("out1")->MarkDirty();
  GetNode("out2")->MarkDirty();
  string err;
  EXPECT_TRUE(plan_.AddTarget(GetNode("out1"), &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(plan_.AddTarget(GetNode("out2"), &err));
  ASSERT_EQ("", err);
  ASSERT_TRUE(plan_.more_to_do());

  Edge* edge = plan_.FindWork();
  ASSERT_TRUE(edge);
  ASSERT_EQ("in",  edge->inputs_[0]->path());
  ASSERT_EQ("out1", edge->outputs_[0]->path());

  // This will be false since poolcat is serialized
  ASSERT_FALSE(plan_.FindWork());

  plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  edge = plan_.FindWork();
  ASSERT_TRUE(edge);
  ASSERT_EQ("in", edge->inputs_[0]->path());
  ASSERT_EQ("out2", edge->outputs_[0]->path());

  ASSERT_FALSE(plan_.FindWork());

  plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  ASSERT_FALSE(plan_.more_to_do());
  edge = plan_.FindWork();
  ASSERT_EQ(0, edge);
}